

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts3InitTokenizer(Fts3Hash *pHash,char *zArg,sqlite3_tokenizer **ppTok,char **pzErr)

{
  bool bVar1;
  sqlite3_tokenizer **ppsVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  size_t sVar8;
  Fts3HashElem *pFVar9;
  sqlite3_tokenizer_module *psVar10;
  char **ppcVar11;
  char **p;
  u64 nBytes;
  int iVar12;
  long lVar13;
  int n;
  int local_54;
  char *local_50;
  char **local_48;
  sqlite3_tokenizer_module *local_40;
  sqlite3_tokenizer **local_38;
  
  local_54 = 0;
  pcVar5 = sqlite3_mprintf("%s");
  iVar12 = 7;
  if (pcVar5 != (char *)0x0) {
    local_38 = ppTok;
    sVar6 = strlen(pcVar5);
    pcVar7 = sqlite3Fts3NextToken(pcVar5,&local_54);
    if (pcVar7 == (char *)0x0) {
      pcVar7 = pcVar5;
    }
    lVar13 = (long)local_54;
    pcVar7[lVar13] = '\0';
    sqlite3Fts3Dequote(pcVar7);
    sVar8 = strlen(pcVar7);
    pFVar9 = sqlite3Fts3HashFindElem(pHash,pcVar7,(int)sVar8 + 1);
    if (pFVar9 == (Fts3HashElem *)0x0) {
      psVar10 = (sqlite3_tokenizer_module *)0x0;
    }
    else {
      psVar10 = (sqlite3_tokenizer_module *)pFVar9->data;
    }
    if (psVar10 == (sqlite3_tokenizer_module *)0x0) {
      pcVar7 = sqlite3_mprintf("unknown tokenizer: %s",pcVar7);
      *pzErr = pcVar7;
      iVar12 = 1;
    }
    else {
      pcVar7 = pcVar7 + lVar13;
      p = (char **)0x0;
      iVar12 = 0;
      local_50 = pcVar5;
      local_48 = pzErr;
      local_40 = psVar10;
      while ((pcVar7 + 1 < pcVar5 + sVar6 &&
             (pcVar7 = sqlite3Fts3NextToken(pcVar7 + 1,&local_54), pcVar7 != (char *)0x0))) {
        iVar3 = sqlite3_initialize();
        if (iVar3 == 0) {
          uVar4 = (iVar12 + 1) * 8;
          nBytes = (u64)uVar4;
          if ((int)uVar4 < 1) {
            nBytes = 0;
          }
          ppcVar11 = (char **)sqlite3Realloc(p,nBytes);
        }
        else {
          ppcVar11 = (char **)0x0;
        }
        if (ppcVar11 == (char **)0x0) {
          sqlite3_free(local_50);
          sqlite3_free(p);
          bVar1 = false;
          pcVar5 = local_50;
          goto LAB_0017f361;
        }
        ppcVar11[iVar12] = pcVar7;
        lVar13 = (long)local_54;
        pcVar7[lVar13] = '\0';
        sqlite3Fts3Dequote(pcVar7);
        pcVar7 = pcVar7 + lVar13;
        p = ppcVar11;
        iVar12 = iVar12 + 1;
      }
      ppsVar2 = local_38;
      psVar10 = local_40;
      uVar4 = (*local_40->xCreate)(iVar12,p,local_38);
      pcVar7 = (char *)(ulong)uVar4;
      if (uVar4 == 0) {
        (*ppsVar2)->pModule = psVar10;
      }
      else {
        pcVar5 = sqlite3_mprintf("unknown tokenizer");
        *local_48 = pcVar5;
      }
      pcVar5 = local_50;
      sqlite3_free(p);
      bVar1 = true;
LAB_0017f361:
      iVar12 = (int)pcVar7;
      if (!bVar1) {
        return 7;
      }
    }
    sqlite3_free(pcVar5);
  }
  return iVar12;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3InitTokenizer(
  Fts3Hash *pHash,                /* Tokenizer hash table */
  const char *zArg,               /* Tokenizer name */
  sqlite3_tokenizer **ppTok,      /* OUT: Tokenizer (if applicable) */
  char **pzErr                    /* OUT: Set to malloced error message */
){
  int rc;
  char *z = (char *)zArg;
  int n = 0;
  char *zCopy;
  char *zEnd;                     /* Pointer to nul-term of zCopy */
  sqlite3_tokenizer_module *m;

  zCopy = sqlite3_mprintf("%s", zArg);
  if( !zCopy ) return SQLITE_NOMEM;
  zEnd = &zCopy[strlen(zCopy)];

  z = (char *)sqlite3Fts3NextToken(zCopy, &n);
  if( z==0 ){
    assert( n==0 );
    z = zCopy;
  }
  z[n] = '\0';
  sqlite3Fts3Dequote(z);

  m = (sqlite3_tokenizer_module *)sqlite3Fts3HashFind(pHash,z,(int)strlen(z)+1);
  if( !m ){
    *pzErr = sqlite3_mprintf("unknown tokenizer: %s", z);
    rc = SQLITE_ERROR;
  }else{
    char const **aArg = 0;
    int iArg = 0;
    z = &z[n+1];
    while( z<zEnd && (NULL!=(z = (char *)sqlite3Fts3NextToken(z, &n))) ){
      int nNew = sizeof(char *)*(iArg+1);
      char const **aNew = (const char **)sqlite3_realloc((void *)aArg, nNew);
      if( !aNew ){
        sqlite3_free(zCopy);
        sqlite3_free((void *)aArg);
        return SQLITE_NOMEM;
      }
      aArg = aNew;
      aArg[iArg++] = z;
      z[n] = '\0';
      sqlite3Fts3Dequote(z);
      z = &z[n+1];
    }
    rc = m->xCreate(iArg, aArg, ppTok);
    assert( rc!=SQLITE_OK || *ppTok );
    if( rc!=SQLITE_OK ){
      *pzErr = sqlite3_mprintf("unknown tokenizer");
    }else{
      (*ppTok)->pModule = m; 
    }
    sqlite3_free((void *)aArg);
  }

  sqlite3_free(zCopy);
  return rc;
}